

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

int __thiscall QByteArrayView::toInt(QByteArrayView *this,bool *ok,int base)

{
  long lVar1;
  int iVar2;
  bool *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000020 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QtPrivate::toIntegral<int,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000020,in_RDI,this._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] int toInt(bool *ok = nullptr, int base = 10) const
    { return QtPrivate::toIntegral<int>(*this, ok, base); }